

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

int ipc_listener_chmod(ipc_listener *l,char *path)

{
  int iVar1;
  char *path_local;
  ipc_listener *l_local;
  
  if (path == (char *)0x0) {
    l_local._4_4_ = 0;
  }
  else if (l->perms == 0) {
    l_local._4_4_ = 0;
  }
  else {
    iVar1 = chmod(path,l->perms & 0xffff0fff);
    if (iVar1 == 0) {
      l_local._4_4_ = 0;
    }
    else {
      l_local._4_4_ = -1;
    }
  }
  return l_local._4_4_;
}

Assistant:

static int
ipc_listener_chmod(ipc_listener *l, const char *path)
{
	if (path == NULL) {
		return (0);
	}
	if (l->perms == 0) {
		return (0);
	}
	if (chmod(path, l->perms & ~S_IFMT) != 0) {
		return (-1);
	}
	return (0);
}